

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidr.c++
# Opt level: O2

void __thiscall kj::CidrRange::CidrRange(CidrRange *this,StringPtr pattern)

{
  ulong count;
  uint *puVar1;
  undefined8 __n;
  uint uVar2;
  StringPtr *this_00;
  int __af;
  Fault f;
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  Array<char> addr_heap;
  StringPtr pattern_local;
  char addr_stack [128];
  
  pattern_local.content.size_ = pattern.content.size_;
  pattern_local.content.ptr = pattern.content.ptr;
  StringPtr::findFirst((StringPtr *)addr_stack,(char)&pattern_local);
  __n = addr_stack._8_8_;
  if (addr_stack[0] != '\x01') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13],kj::StringPtr&>
              ((Fault *)addr_stack,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
               ,0x33,FAILED,"pattern.findFirst(\'/\') != nullptr","\"invalid CIDR\", pattern",
               (char (*) [13])"invalid CIDR",&pattern_local);
    kj::_::Debug::Fault::fatal((Fault *)addr_stack);
  }
  this_00 = (StringPtr *)addr_stack;
  count = addr_stack._8_8_ + 1;
  addr_stack._0_8_ = pattern_local.content.ptr + count;
  addr_stack._8_8_ = pattern_local.content.size_ - count;
  uVar2 = StringPtr::parseAs<unsigned_int>(this_00);
  this->bitCount = uVar2;
  if (count < 0x81) {
    addr_heap.ptr = (char *)0x0;
    addr_heap.size_ = 0;
    addr_heap.disposer = (ArrayDisposer *)0x0;
  }
  else {
    this_00 = (StringPtr *)kj::_::HeapArrayDisposer::allocate<char>(count);
    addr_heap.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    addr_heap.ptr = (char *)this_00;
    addr_heap.size_ = count;
  }
  memcpy(this_00,pattern_local.content.ptr,__n);
  *(undefined1 *)((long)&(this_00->content).ptr + __n) = 0;
  StringPtr::findFirst((StringPtr *)&_kjCondition,(char)&pattern_local);
  puVar1 = &this->bitCount;
  _kjCondition.left = puVar1;
  if ((char)_kjCondition.left == '\0') {
    this->family = 2;
    _kjCondition.result = this->bitCount < 0x21;
    _kjCondition.right = 0x20;
    _kjCondition.op.content.ptr = " <= ";
    _kjCondition.op.content.size_ = 5;
    if (!_kjCondition.result) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&,char_const(&)[13],kj::StringPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
                 ,0x3d,FAILED,"bitCount <= 32","_kjCondition,\"invalid CIDR\", pattern",
                 &_kjCondition,(char (*) [13])"invalid CIDR",&pattern_local);
      kj::_::Debug::Fault::fatal(&f);
    }
    __af = 2;
  }
  else {
    this->family = 10;
    _kjCondition.result = this->bitCount < 0x81;
    _kjCondition.right = 0x80;
    _kjCondition.op.content.ptr = " <= ";
    _kjCondition.op.content.size_ = 5;
    if (!_kjCondition.result) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&,char_const(&)[13],kj::StringPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
                 ,0x40,FAILED,"bitCount <= 128","_kjCondition,\"invalid CIDR\", pattern",
                 &_kjCondition,(char (*) [13])"invalid CIDR",&pattern_local);
      kj::_::Debug::Fault::fatal(&f);
    }
    __af = 10;
  }
  _kjCondition.op.content.size_ = 5;
  _kjCondition.op.content.ptr = " <= ";
  uVar2 = inet_pton(__af,(char *)this_00,this->bits);
  _kjCondition.left = (uint *)(ulong)uVar2;
  _kjCondition._8_8_ = anon_var_dwarf_3b390a;
  _kjCondition.op.content.ptr = &DAT_00000004;
  _kjCondition.op.content.size_ = CONCAT71(_kjCondition.op.content.size_._1_7_,0 < (int)uVar2);
  if (0 < (int)uVar2) {
    zeroIrrelevantBits(this);
    Array<char>::~Array(&addr_heap);
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<int,int>&,char_const(&)[13],kj::StringPtr&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
             ,0x43,FAILED,"inet_pton(family, addr.begin(), bits) > 0",
             "_kjCondition,\"invalid CIDR\", pattern",(DebugComparison<int,_int> *)&_kjCondition,
             (char (*) [13])"invalid CIDR",&pattern_local);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

CidrRange::CidrRange(StringPtr pattern) {
  size_t slashPos = KJ_REQUIRE_NONNULL(pattern.findFirst('/'), "invalid CIDR", pattern);

  bitCount = pattern.slice(slashPos + 1).parseAs<uint>();

  KJ_STACK_ARRAY(char, addr, slashPos + 1, 128, 128);
  memcpy(addr.begin(), pattern.begin(), slashPos);
  addr[slashPos] = '\0';

  if (pattern.findFirst(':') == kj::none) {
    family = AF_INET;
    KJ_REQUIRE(bitCount <= 32, "invalid CIDR", pattern);
  } else {
    family = AF_INET6;
    KJ_REQUIRE(bitCount <= 128, "invalid CIDR", pattern);
  }

  KJ_ASSERT(inet_pton(family, addr.begin(), bits) > 0, "invalid CIDR", pattern);
  zeroIrrelevantBits();
}